

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined1 auVar4 [16];
  undefined3 in_register_00000011;
  uint uVar5;
  uint uVar6;
  ImVec2 IVar7;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  ImVec2 IVar8;
  
  IVar7 = *r_min;
  IVar8 = *r_max;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = IVar8.x;
  auVar9._4_4_ = IVar8.y;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar3 = GImGui->CurrentWindow;
    IVar8 = (pIVar3->ClipRect).Min;
    fVar10 = IVar8.x;
    fVar11 = IVar8.y;
    uVar5 = -(uint)(fVar10 <= IVar7.x);
    uVar6 = -(uint)(fVar11 <= IVar7.y);
    IVar7 = (ImVec2)(CONCAT44((uint)IVar7.y & uVar6,(uint)IVar7.x & uVar5) |
                    CONCAT44(~uVar6 & (uint)fVar11,~uVar5 & (uint)fVar10));
    auVar4._8_8_ = 0;
    auVar4._0_4_ = (pIVar3->ClipRect).Max.x;
    auVar4._4_4_ = (pIVar3->ClipRect).Max.y;
    auVar9 = minps(auVar9,auVar4);
    IVar8 = auVar9._0_8_;
  }
  fVar10 = (GImGui->Style).TouchExtraPadding.x;
  fVar11 = (GImGui->IO).MousePos.x;
  if (fVar11 < IVar7.x - fVar10) {
    return false;
  }
  fVar1 = (GImGui->Style).TouchExtraPadding.y;
  fVar2 = (GImGui->IO).MousePos.y;
  return (bool)(fVar2 < IVar8.y + fVar1 & -(IVar7.y - fVar1 <= fVar2) & -(fVar11 < fVar10 + IVar8.x)
               );
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}